

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.c
# Opt level: O2

cgltf_result
cgltf_load_buffer_base64(cgltf_options *options,cgltf_size size,char *base64,void **out_data)

{
  char cVar1;
  cgltf_result cVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  _func_void_ptr_void_ptr_cgltf_size *p_Var6;
  cgltf_size cVar7;
  int iVar8;
  uint uVar9;
  _func_void_void_ptr_void_ptr *p_Var10;
  
  p_Var6 = cgltf_default_alloc;
  if (options->memory_alloc != (_func_void_ptr_void_ptr_cgltf_size *)0x0) {
    p_Var6 = options->memory_alloc;
  }
  p_Var10 = cgltf_default_free;
  if (options->memory_free != (_func_void_void_ptr_void_ptr *)0x0) {
    p_Var10 = options->memory_free;
  }
  pvVar3 = (*p_Var6)(options->memory_user_data,size);
  if (pvVar3 == (void *)0x0) {
    cVar2 = cgltf_result_out_of_memory;
  }
  else {
    uVar5 = 0;
    uVar4 = 0;
    for (cVar7 = 0; cVar7 != size; cVar7 = cVar7 + 1) {
      for (; uVar4 < 8; uVar4 = uVar4 + 6) {
        cVar1 = *base64;
        iVar8 = (int)cVar1;
        uVar9 = iVar8 - 0x41;
        if (0x19 < uVar9) {
          if (iVar8 - 0x61U < 0x1a) {
            uVar9 = iVar8 - 0x47;
          }
          else if (iVar8 - 0x30U < 10) {
            uVar9 = iVar8 + 4;
          }
          else {
            uVar9 = 0x3e;
            if (cVar1 != '+') {
              if (cVar1 != '/') {
                (*p_Var10)(options->memory_user_data,pvVar3);
                return cgltf_result_io_error;
              }
              uVar9 = 0x3f;
            }
          }
        }
        base64 = base64 + 1;
        uVar5 = uVar5 << 6 | uVar9;
      }
      uVar4 = uVar4 - 8;
      *(char *)((long)pvVar3 + cVar7) = (char)(uVar5 >> ((byte)uVar4 & 0x1f));
    }
    *out_data = pvVar3;
    cVar2 = cgltf_result_success;
  }
  return cVar2;
}

Assistant:

cgltf_result cgltf_load_buffer_base64(const cgltf_options* options, cgltf_size size, const char* base64, void** out_data)
{
    void* (*memory_alloc)(void*, cgltf_size) = options->memory_alloc ? options->memory_alloc : &cgltf_default_alloc;
    void (*memory_free)(void*, void*) = options->memory_free ? options->memory_free : &cgltf_default_free;

    unsigned char* data = (unsigned char*)memory_alloc(options->memory_user_data, size);
    if (!data)
    {
        return cgltf_result_out_of_memory;
    }

    unsigned int buffer = 0;
    unsigned int buffer_bits = 0;

    for (cgltf_size i = 0; i < size; ++i)
    {
        while (buffer_bits < 8)
        {
            char ch = *base64++;

            int index =
                (unsigned)(ch - 'A') < 26 ? (ch - 'A') :
                (unsigned)(ch - 'a') < 26 ? (ch - 'a') + 26 :
                (unsigned)(ch - '0') < 10 ? (ch - '0') + 52 :
                ch == '+' ? 62 :
                ch == '/' ? 63 :
                -1;

            if (index < 0)
            {
                memory_free(options->memory_user_data, data);
                return cgltf_result_io_error;
            }

            buffer = (buffer << 6) | index;
            buffer_bits += 6;
        }

        data[i] = (unsigned char)(buffer >> (buffer_bits - 8));
        buffer_bits -= 8;
    }

    *out_data = data;

    return cgltf_result_success;
}